

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::Parser(Parser *this,char *szFile,uint fileFormatDefault)

{
  memset(&this->m_clrBackground,0,0x90);
  if (szFile != (char *)0x0) {
    this->filePtr = szFile;
    this->iFileFormat = fileFormatDefault;
    (this->m_clrBackground).r = NAN;
    (this->m_clrAmbient).r = NAN;
    this->iLineNumber = 0;
    this->iFirstFrame = 0;
    this->iLastFrame = 0;
    this->iFrameSpeed = 0x1e;
    this->iTicksPerFrame = 1;
    this->bLastWasEndLine = false;
    return;
  }
  __assert_fail("__null != szFile",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/ASE/ASEParser.cpp"
                ,0x7b,"Assimp::ASE::Parser::Parser(const char *, unsigned int)");
}

Assistant:

Parser::Parser (const char* szFile, unsigned int fileFormatDefault)
{
    ai_assert(NULL != szFile);
    filePtr = szFile;
    iFileFormat = fileFormatDefault;

    // make sure that the color values are invalid
    m_clrBackground.r = get_qnan();
    m_clrAmbient.r    = get_qnan();

    // setup some default values
    iLineNumber = 0;
    iFirstFrame = 0;
    iLastFrame = 0;
    iFrameSpeed = 30;        // use 30 as default value for this property
    iTicksPerFrame = 1;      // use 1 as default value for this property
    bLastWasEndLine = false; // need to handle \r\n seqs due to binary file mapping
}